

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_set_standard_lookup.c
# Opt level: O0

void cleanup(EVP_PKEY_CTX *ctx)

{
  int iVar1;
  uint local_c;
  uint i;
  
  if (initialized != 0) {
    post(&exit_message);
    for (local_c = 0; local_c < nthreads; local_c = local_c + 1) {
      iVar1 = uv_thread_join(threads + local_c);
      if (iVar1 != 0) {
        abort();
      }
    }
    if (threads != default_threads) {
      uv__free(threads);
    }
    uv_mutex_destroy(&mutex);
    uv_cond_destroy(&cond);
    threads = (uv_thread_t *)0x0;
    nthreads = 0;
    initialized = 0;
  }
  return;
}

Assistant:

static void
cleanup(void *data)
{
	struct name_cache *cache = (struct name_cache *)data;
	size_t i;

	if (cache != NULL) {
		for (i = 0; i < cache->size; i++) {
			if (cache->cache[i].name != NULL &&
			    cache->cache[i].name != NO_NAME)
				free((void *)(uintptr_t)cache->cache[i].name);
		}
		free(cache->buff);
		free(cache);
	}
}